

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O3

string * __thiscall
upb::generator::MiniTableMessageVarName_abi_cxx11_
          (string *__return_storage_ptr__,generator *this,string_view full_name)

{
  long lVar1;
  long *plVar2;
  size_type *psVar3;
  size_type in_R9;
  FixedMapping replacements;
  string_view s;
  string local_70;
  char local_50 [8];
  char *local_48;
  undefined8 local_40;
  char *local_38;
  undefined8 local_30;
  char *local_28;
  undefined8 local_20;
  char *local_18;
  
  s._M_len = full_name._M_len;
  local_50[0] = '\x01';
  local_50[1] = '\0';
  local_50[2] = '\0';
  local_50[3] = '\0';
  local_50[4] = '\0';
  local_50[5] = '\0';
  local_50[6] = '\0';
  local_50[7] = '\0';
  local_48 = "_";
  local_40 = 2;
  local_38 = "_0";
  local_30 = 1;
  local_28 = ".";
  local_20 = 2;
  local_18 = "__";
  replacements._M_len = in_R9;
  replacements._M_array = (iterator)0x2;
  s._M_str = local_50;
  absl::lts_20250127::StrReplaceAll_abi_cxx11_(&local_70,(lts_20250127 *)this,s,replacements);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_70);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar3) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string MiniTableMessageVarName(absl::string_view full_name) {
  return MangleName(full_name) + "_msg_init";
}